

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_metric_remove(nhdp_domain_metric *metric)

{
  list_entity *plVar1;
  
  plVar1 = &_domain_list;
  do {
    plVar1 = plVar1->next;
    if (plVar1->prev == _domain_list.prev) goto LAB_0010652b;
  } while ((nhdp_domain_metric *)plVar1[-0x28].next != metric);
  _remove_metric((nhdp_domain *)(plVar1 + -0x2a));
LAB_0010652b:
  avl_remove(&_domain_metrics,&metric->_node);
  return;
}

Assistant:

void
nhdp_domain_metric_remove(struct nhdp_domain_metric *metric) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      _remove_metric(domain);
      break;
    }
  }

  avl_remove(&_domain_metrics, &metric->_node);
}